

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

Z80Reg Z80::OpCode_CbFamily(int baseOpcode,int *e,bool canHaveDstRegForIxy)

{
  bool bVar1;
  Z80Reg ZVar2;
  Z80Reg ZVar3;
  undefined4 in_register_0000003c;
  char **p;
  
  ZVar2 = GetRegister((char **)CONCAT44(in_register_0000003c,baseOpcode));
  if ((uint)ZVar2 < 8) {
    *e = 0xcb;
    e[1] = ZVar2 + baseOpcode;
    ZVar2 = Z80_A;
  }
  else if ((ZVar2 == Z80_MEM_IX) || (ZVar2 == Z80_MEM_IY)) {
    *e = ZVar2 & 0xff;
    e[1] = 0xcb;
    e[2] = GetRegister_lastIxyD;
    e[3] = ((uint)ZVar2 >> 8) + baseOpcode;
    ZVar2 = Z80_A;
    if (canHaveDstRegForIxy) {
      p = &lp;
      bVar1 = comma(&lp);
      if (bVar1) {
        ZVar3 = GetRegister(p);
        if (((uint)ZVar3 < 8) && (ZVar3 != Z80_MEM_HL)) {
          e[3] = ZVar3 + baseOpcode;
        }
        else {
          Error("Illegal destination register",::line,PASS3);
        }
      }
    }
  }
  return ZVar2;
}

Assistant:

static Z80Reg OpCode_CbFamily(const int baseOpcode, int* e, bool canHaveDstRegForIxy = true) {
		Z80Reg reg;
		switch (reg = GetRegister(lp)) {
		case Z80_B: case Z80_C: case Z80_D: case Z80_E:
		case Z80_H: case Z80_L: case Z80_MEM_HL: case Z80_A:
			e[0] = 0xcb; e[1] = baseOpcode + reg;
			return Z80_A;
		case Z80_MEM_IX: case Z80_MEM_IY:
			e[0] = reg&0xFF; e[1] = 0xcb; e[2] = GetRegister_lastIxyD; e[3] = baseOpcode + (reg>>8);
			if (canHaveDstRegForIxy && comma(lp)) {
				switch (reg = GetRegister(lp)) {
				case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L: case Z80_A:
					e[3] = baseOpcode + reg;
					break;
				default:
					Error("Illegal destination register", line);
				}
			}
			return Z80_A;
		default: break;
		}
		return reg;
	}